

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_buffer.c
# Opt level: O2

zip_int64_t read_data(void *state,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  undefined8 uVar1;
  long *plVar2;
  buffer_t *buffer;
  zip_buffer_fragment_t *pzVar3;
  _Bool _Var4;
  int iVar5;
  zip_uint8_t *pzVar6;
  zip_int64_t zVar7;
  zip_uint64_t zVar8;
  zip_uint64_t *pzVar9;
  ulong uVar10;
  zip_uint64_t zVar11;
  buffer_t *pbVar12;
  int se;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  zip_uint64_t zVar18;
  long lVar19;
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    pbVar12 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010c224;
  case ZIP_SOURCE_READ:
    if (-1 < (long)len) {
      plVar2 = *(long **)((long)state + 0x30);
      uVar14 = plVar2[7] - plVar2[8];
      if (len <= uVar14) {
        uVar14 = len;
      }
      if (uVar14 == 0) {
        return 0;
      }
      lVar15 = plVar2[9];
      lVar19 = plVar2[8] - *(long *)(plVar2[1] + lVar15 * 8);
      for (uVar10 = 0; uVar16 = uVar14 - uVar10, uVar10 <= uVar14 && uVar16 != 0;
          uVar10 = uVar10 + uVar13) {
        lVar17 = lVar15 * 0x10;
        uVar13 = *(long *)(*plVar2 + 8 + lVar17) - lVar19;
        if (uVar16 < uVar13) {
          uVar13 = uVar16;
        }
        memcpy((void *)((long)data + uVar10),(void *)(*(long *)(*plVar2 + lVar17) + lVar19),uVar13);
        lVar15 = lVar15 + (ulong)(uVar13 == *(long *)(*plVar2 + 8 + lVar17) - lVar19);
        lVar19 = 0;
      }
      plVar2[8] = plVar2[8] + uVar10;
      plVar2[9] = lVar15;
      return uVar10;
    }
    goto LAB_0010c236;
  case ZIP_SOURCE_CLOSE:
    break;
  case ZIP_SOURCE_STAT:
    if (0x3f < len) {
      zip_stat_init((zip_stat_t *)data);
      *(undefined8 *)((long)data + 0x28) = *(undefined8 *)((long)state + 0x10);
      uVar1 = *(undefined8 *)(*(long *)((long)state + 0x30) + 0x38);
      *(undefined8 *)((long)data + 0x18) = uVar1;
      *(undefined8 *)((long)data + 0x20) = uVar1;
      *(undefined4 *)((long)data + 0x34) = 0;
      *(undefined8 *)data = 0xdc;
      return 0x40;
    }
    goto LAB_0010c236;
  case ZIP_SOURCE_ERROR:
    zVar7 = zip_error_to_data((zip_error_t *)state,data,len);
    return zVar7;
  case ZIP_SOURCE_FREE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    buffer_free(*(buffer_t **)((long)state + 0x38));
    free(state);
    break;
  case ZIP_SOURCE_SEEK:
    pbVar12 = *(buffer_t **)((long)state + 0x30);
    goto LAB_0010c123;
  case ZIP_SOURCE_TELL:
    lVar15 = *(long *)((long)state + 0x30);
    goto LAB_0010c13d;
  case ZIP_SOURCE_BEGIN_WRITE:
    pbVar12 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    *(buffer_t **)((long)state + 0x38) = pbVar12;
    if (pbVar12 == (buffer_t *)0x0) {
      return -1;
    }
LAB_0010c224:
    pbVar12->offset = 0;
    pbVar12->current_fragment = 0;
    break;
  case ZIP_SOURCE_COMMIT_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(undefined8 *)((long)state + 0x30) = *(undefined8 *)((long)state + 0x38);
    goto LAB_0010c206;
  case ZIP_SOURCE_ROLLBACK_WRITE:
    buffer_free(*(buffer_t **)((long)state + 0x38));
LAB_0010c206:
    *(undefined8 *)((long)state + 0x38) = 0;
    break;
  case ZIP_SOURCE_WRITE:
    if (-1 < (long)len) {
      pbVar12 = *(buffer_t **)((long)state + 0x38);
      zVar18 = pbVar12->offset;
      if (len <= -zVar18 - 0x10000) {
        pzVar9 = pbVar12->fragment_offsets;
        uVar14 = pzVar9[pbVar12->nfragments];
        lVar15 = (len + zVar18) - uVar14;
        if (len + zVar18 < uVar14 || lVar15 == 0) goto LAB_0010c30b;
        uVar16 = (lVar15 + 0xffffU >> 0x10) + pbVar12->nfragments;
        uVar10 = pbVar12->fragments_capacity;
        if (uVar10 < uVar16) {
          uVar13 = 0x10;
          if (uVar10 != 0) {
            uVar13 = uVar10;
          }
          do {
            uVar10 = uVar13;
            uVar13 = uVar10 * 2;
          } while (uVar10 < uVar16);
          _Var4 = buffer_grow_fragments(pbVar12,uVar10,(zip_error_t *)state);
          if (!_Var4) {
LAB_0010c2fc:
            iVar5 = 0xe;
            goto LAB_0010c238;
          }
        }
        while( true ) {
          uVar14 = uVar14 + 0x10000;
          uVar10 = pbVar12->nfragments;
          if (uVar16 <= uVar10) break;
          pzVar6 = (zip_uint8_t *)malloc(0x10000);
          pzVar3 = pbVar12->fragments;
          pzVar3[uVar10].data = pzVar6;
          if (pzVar6 == (zip_uint8_t *)0x0) goto LAB_0010c2fc;
          pzVar3[uVar10].length = 0x10000;
          pbVar12->nfragments = uVar10 + 1;
          pbVar12->fragment_offsets[uVar10 + 1] = uVar14;
        }
        pzVar9 = pbVar12->fragment_offsets;
        zVar18 = pbVar12->offset;
LAB_0010c30b:
        zVar8 = pbVar12->current_fragment;
        lVar15 = zVar18 - pzVar9[zVar8];
        for (uVar14 = 0; uVar10 = len - uVar14, uVar14 <= len && uVar10 != 0;
            uVar14 = uVar14 + uVar16) {
          uVar16 = pbVar12->fragments[zVar8].length - lVar15;
          if (uVar10 < uVar16) {
            uVar16 = uVar10;
          }
          memcpy(pbVar12->fragments[zVar8].data + lVar15,(void *)((long)data + uVar14),uVar16);
          zVar8 = zVar8 + (uVar16 == pbVar12->fragments[zVar8].length - lVar15);
          lVar15 = 0;
        }
        uVar10 = pbVar12->offset + uVar14;
        pbVar12->offset = uVar10;
        pbVar12->current_fragment = zVar8;
        if (pbVar12->size < uVar10) {
          pbVar12->size = uVar10;
          return uVar14;
        }
        return uVar14;
      }
    }
    goto LAB_0010c236;
  case ZIP_SOURCE_SEEK_WRITE:
    pbVar12 = *(buffer_t **)((long)state + 0x38);
LAB_0010c123:
    iVar5 = buffer_seek(pbVar12,data,len,(zip_error_t *)state);
    return (long)iVar5;
  case ZIP_SOURCE_TELL_WRITE:
    lVar15 = *(long *)((long)state + 0x38);
LAB_0010c13d:
    if (-1 < *(long *)(lVar15 + 0x40)) {
      return *(long *)(lVar15 + 0x40);
    }
    iVar5 = 0x1e;
    se = 0x4b;
    goto LAB_0010c23e;
  case ZIP_SOURCE_SUPPORTS:
    zVar7 = zip_source_make_command_bitmap
                      (ZIP_SOURCE_GET_FILE_ATTRIBUTES,0,1,2,3,4,5,6,7,8,0x11,9,0xf,10,0xc,0xd,0xb,
                       0xffffffff);
    return zVar7;
  case ZIP_SOURCE_REMOVE:
    pbVar12 = buffer_new((zip_buffer_fragment_t *)0x0,0,0,(zip_error_t *)state);
    if (pbVar12 == (buffer_t *)0x0) {
      return -1;
    }
    buffer_free(*(buffer_t **)((long)state + 0x30));
    *(buffer_t **)((long)state + 0x30) = pbVar12;
    break;
  default:
    iVar5 = 0x1c;
    goto LAB_0010c238;
  case ZIP_SOURCE_BEGIN_WRITE_CLONING:
    if (len == 0) {
      pbVar12 = buffer_new((zip_buffer_fragment_t *)0x0,0,1,(zip_error_t *)state);
      *(buffer_t **)((long)state + 0x38) = pbVar12;
      if (pbVar12 == (buffer_t *)0x0) {
        return -1;
      }
      zVar18 = pbVar12->nfragments;
LAB_0010c2ab:
      pbVar12->offset = len;
      pbVar12->current_fragment = zVar18;
      return 0;
    }
    buffer = *(buffer_t **)((long)state + 0x30);
    if (buffer->size < len) {
      iVar5 = 0x12;
    }
    else if (buffer->shared_buffer == (buffer *)0x0) {
      zVar8 = buffer_find_fragment(buffer,len);
      pzVar3 = buffer->fragments;
      zVar18 = len - buffer->fragment_offsets[zVar8];
      if (zVar18 == 0) {
        zVar11 = pzVar3[zVar8 - 1].length;
        zVar18 = zVar11;
      }
      else {
        zVar11 = pzVar3[zVar8].length;
        zVar8 = zVar8 + 1;
      }
      if (zVar11 - zVar18 <= len) {
        pbVar12 = buffer_new(pzVar3,zVar8,0,(zip_error_t *)state);
        if (pbVar12 != (buffer_t *)0x0) {
          zVar11 = pbVar12->nfragments;
          pbVar12->fragments[zVar11 - 1].length = zVar18;
          pbVar12->fragment_offsets[zVar11] = len;
          pbVar12->size = len;
          zVar18 = pbVar12->nfragments;
          uVar14 = zVar18 - 1;
          if (buffer->first_owned_fragment < zVar18 - 1) {
            uVar14 = buffer->first_owned_fragment;
          }
          pbVar12->first_owned_fragment = uVar14;
          buffer->shared_buffer = pbVar12;
          pbVar12->shared_buffer = buffer;
          buffer->shared_fragments = zVar18;
          pbVar12->shared_fragments = zVar8;
          *(buffer_t **)((long)state + 0x38) = pbVar12;
          goto LAB_0010c2ab;
        }
        goto LAB_0010c3b6;
      }
      iVar5 = 0x1c;
    }
    else {
      iVar5 = 0x1d;
    }
    zip_error_set((zip_error_t *)state,iVar5,0);
LAB_0010c3b6:
    *(undefined8 *)((long)state + 0x38) = 0;
    return -1;
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)state + 0x28);
      uVar1 = *(undefined8 *)((long)state + 0x20);
      *(undefined8 *)data = *(undefined8 *)((long)state + 0x18);
      *(undefined8 *)((long)data + 8) = uVar1;
      return 0x18;
    }
LAB_0010c236:
    iVar5 = 0x12;
LAB_0010c238:
    se = 0;
LAB_0010c23e:
    zip_error_set((zip_error_t *)state,iVar5,se);
    return -1;
  }
  return 0;
}

Assistant:

static zip_int64_t
read_data(void *state, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct read_data *ctx = (struct read_data *)state;

    switch (cmd) {
    case ZIP_SOURCE_BEGIN_WRITE:
	if ((ctx->out = buffer_new(NULL, 0, 0, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = 0;
	ctx->out->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_BEGIN_WRITE_CLONING:
	if ((ctx->out = buffer_clone(ctx->in, len, &ctx->error)) == NULL) {
	    return -1;
	}
	ctx->out->offset = len;
	ctx->out->current_fragment = ctx->out->nfragments;
	return 0;

    case ZIP_SOURCE_CLOSE:
	return 0;

    case ZIP_SOURCE_COMMIT_WRITE:
	buffer_free(ctx->in);
	ctx->in = ctx->out;
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_ERROR:
	return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
	buffer_free(ctx->in);
	buffer_free(ctx->out);
	free(ctx);
	return 0;

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES: {
	if (len < sizeof(ctx->attributes)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	memcpy(data, &ctx->attributes, sizeof(ctx->attributes));

	return sizeof(ctx->attributes);
    }

    case ZIP_SOURCE_OPEN:
	ctx->in->offset = 0;
	ctx->in->current_fragment = 0;
	return 0;

    case ZIP_SOURCE_READ:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_read(ctx->in, data, len);

    case ZIP_SOURCE_REMOVE: {
	buffer_t *empty = buffer_new(NULL, 0, 0, &ctx->error);
	if (empty == NULL) {
	    return -1;
	}

	buffer_free(ctx->in);
	ctx->in = empty;
	return 0;
    }

    case ZIP_SOURCE_ROLLBACK_WRITE:
	buffer_free(ctx->out);
	ctx->out = NULL;
	return 0;

    case ZIP_SOURCE_SEEK:
	return buffer_seek(ctx->in, data, len, &ctx->error);

    case ZIP_SOURCE_SEEK_WRITE:
	return buffer_seek(ctx->out, data, len, &ctx->error);

    case ZIP_SOURCE_STAT: {
	zip_stat_t *st;

	if (len < sizeof(*st)) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}

	st = (zip_stat_t *)data;

	zip_stat_init(st);
	st->mtime = ctx->mtime;
	st->size = ctx->in->size;
	st->comp_size = st->size;
	st->comp_method = ZIP_CM_STORE;
	st->encryption_method = ZIP_EM_NONE;
	st->valid = ZIP_STAT_MTIME | ZIP_STAT_SIZE | ZIP_STAT_COMP_SIZE | ZIP_STAT_COMP_METHOD | ZIP_STAT_ENCRYPTION_METHOD;

	return sizeof(*st);
    }

    case ZIP_SOURCE_SUPPORTS:
	return zip_source_make_command_bitmap(ZIP_SOURCE_GET_FILE_ATTRIBUTES, ZIP_SOURCE_OPEN, ZIP_SOURCE_READ, ZIP_SOURCE_CLOSE, ZIP_SOURCE_STAT, ZIP_SOURCE_ERROR, ZIP_SOURCE_FREE, ZIP_SOURCE_SEEK, ZIP_SOURCE_TELL, ZIP_SOURCE_BEGIN_WRITE, ZIP_SOURCE_BEGIN_WRITE_CLONING, ZIP_SOURCE_COMMIT_WRITE, ZIP_SOURCE_REMOVE, ZIP_SOURCE_ROLLBACK_WRITE, ZIP_SOURCE_SEEK_WRITE, ZIP_SOURCE_TELL_WRITE, ZIP_SOURCE_WRITE, -1);

    case ZIP_SOURCE_TELL:
	if (ctx->in->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->in->offset;


    case ZIP_SOURCE_TELL_WRITE:
	if (ctx->out->offset > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_TELL, EOVERFLOW);
	    return -1;
	}
	return (zip_int64_t)ctx->out->offset;

    case ZIP_SOURCE_WRITE:
	if (len > ZIP_INT64_MAX) {
	    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
	    return -1;
	}
	return buffer_write(ctx->out, data, len, &ctx->error);

    default:
	zip_error_set(&ctx->error, ZIP_ER_OPNOTSUPP, 0);
	return -1;
    }
}